

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O0

int __thiscall
ot::commissioner::JoinerSession::RelaySocket::Receive
          (RelaySocket *this,uint8_t *aBuf,size_t aMaxLen)

{
  size_t __dest;
  bool bVar1;
  unsigned_long *puVar2;
  uchar *__src;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  const_iterator local_48;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  const_iterator local_38;
  size_type local_30;
  int local_24;
  size_t sStack_20;
  int rval;
  size_t aMaxLen_local;
  uint8_t *aBuf_local;
  RelaySocket *this_local;
  
  sStack_20 = aMaxLen;
  aMaxLen_local = (size_t)aBuf;
  aBuf_local = (uint8_t *)this;
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->mRecvBuf);
  if (bVar1) {
    local_24 = -0x6900;
  }
  else {
    local_30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->mRecvBuf);
    puVar2 = std::min<unsigned_long>(&stack0xffffffffffffffe0,&local_30);
    __dest = aMaxLen_local;
    local_24 = (int)*puVar2;
    __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->mRecvBuf);
    memcpy((void *)__dest,__src,(long)local_24);
    local_40._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->mRecvBuf)
    ;
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_38,&local_40);
    local_58._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->mRecvBuf)
    ;
    local_50 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_58,(long)local_24);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_48,&local_50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
              (&this->mRecvBuf,local_38,local_48);
  }
  return local_24;
}

Assistant:

int JoinerSession::RelaySocket::Receive(uint8_t *aBuf, size_t aMaxLen)
{
    int rval;

    VerifyOrExit(!mRecvBuf.empty(), rval = MBEDTLS_ERR_SSL_WANT_READ);

    rval = static_cast<int>(std::min(aMaxLen, mRecvBuf.size()));
    memcpy(aBuf, mRecvBuf.data(), rval);
    mRecvBuf.erase(mRecvBuf.begin(), mRecvBuf.begin() + rval);

exit:
    return rval;
}